

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.cpp
# Opt level: O2

void baryonyx::context_set_solver_parameters(context_ptr *ctx,solver_parameters *params)

{
  undefined4 uVar1;
  double dVar2;
  double dVar3;
  undefined4 uVar4;
  context *pcVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  constraint_order cVar9;
  floating_point_type fVar10;
  init_policy_type iVar11;
  cost_norm_type cVar12;
  mode_type mVar13;
  preprocessor_options pVar14;
  observer_type oVar15;
  solver_type sVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  undefined1 auVar33 [16];
  undefined8 in_XMM5_Qb;
  
  auVar19._8_8_ = 0;
  auVar19._0_8_ = params->time_limit;
  pcVar5 = (ctx->_M_t).super___uniq_ptr_impl<baryonyx::context,_void_(*)(baryonyx::context_*)>._M_t.
           super__Tuple_impl<0UL,_baryonyx::context_*,_void_(*)(baryonyx::context_*)>.
           super__Head_base<0UL,_baryonyx::context_*,_false>._M_head_impl;
  uVar6 = vcmpsd_avx512f(auVar19,ZEXT816(0) << 0x40,6);
  bVar7 = (bool)((byte)uVar6 & 1);
  (pcVar5->parameters).time_limit =
       (double)((ulong)bVar7 * (long)params->time_limit + (ulong)!bVar7 * 0x7ff0000000000000);
  dVar2 = params->theta;
  if ((0.0 <= dVar2) && (dVar2 <= 1.0)) {
    (pcVar5->parameters).theta = dVar2;
  }
  dVar2 = params->delta;
  if (((dVar2 == -1.0) && (!NAN(dVar2))) || (0.0 <= dVar2)) {
    (pcVar5->parameters).delta = dVar2;
  }
  dVar2 = params->kappa_max;
  auVar19 = ZEXT816(0x3ff0000000000000);
  if ((((dVar2 <= 1.0) && (dVar32 = params->kappa_min, dVar32 < 1.0)) &&
      ((0.0 <= dVar32 && ((dVar32 < dVar2 && (dVar3 = params->kappa_step, 0.0 <= dVar3)))))) &&
     (dVar3 < 1.0)) {
    (pcVar5->parameters).kappa_min = dVar32;
    (pcVar5->parameters).kappa_step = dVar3;
    (pcVar5->parameters).kappa_max = dVar2;
  }
  if (0.0 <= params->alpha) {
    (pcVar5->parameters).alpha = params->alpha;
  }
  if ((ulong)ABS(params->pushing_k_factor) < 0x7ff0000000000000) {
    (pcVar5->parameters).pushing_k_factor = params->pushing_k_factor;
  }
  if ((ulong)ABS(params->pushing_objective_amplifier) < 0x7ff0000000000000) {
    (pcVar5->parameters).pushing_objective_amplifier = params->pushing_objective_amplifier;
  }
  if ((ulong)ABS(params->init_crossover_bastert_insertion) < 0x7ff0000000000000) {
    auVar20._8_8_ = 0;
    auVar20._0_8_ = params->init_crossover_bastert_insertion;
    auVar27 = vminsd_avx(auVar19,auVar20);
    uVar6 = vcmpsd_avx512f(auVar20,ZEXT816(0) << 0x40,1);
    (pcVar5->parameters).init_crossover_bastert_insertion =
         (double)((ulong)!(bool)((byte)uVar6 & 1) * auVar27._0_8_);
  }
  if ((ulong)ABS(params->init_crossover_solution_selection_mean) < 0x7ff0000000000000) {
    auVar21._8_8_ = 0;
    auVar21._0_8_ = params->init_crossover_solution_selection_mean;
    auVar27 = vminsd_avx(auVar19,auVar21);
    uVar6 = vcmpsd_avx512f(auVar21,ZEXT816(0) << 0x40,1);
    (pcVar5->parameters).init_crossover_solution_selection_mean =
         (double)((ulong)!(bool)((byte)uVar6 & 1) * auVar27._0_8_);
  }
  if ((ulong)ABS(params->init_crossover_solution_selection_stddev) < 0x7ff0000000000000) {
    auVar22._8_8_ = 0;
    auVar22._0_8_ = params->init_crossover_solution_selection_stddev;
    auVar27 = vminsd_avx(auVar19,auVar22);
    uVar6 = vcmpsd_avx512f(auVar22,ZEXT816(0) << 0x40,1);
    (pcVar5->parameters).init_crossover_solution_selection_stddev =
         (double)((ulong)!(bool)((byte)uVar6 & 1) * auVar27._0_8_);
  }
  if ((ulong)ABS(params->init_mutation_variable_mean) < 0x7ff0000000000000) {
    auVar23._8_8_ = 0;
    auVar23._0_8_ = params->init_mutation_variable_mean;
    auVar27 = vminsd_avx(auVar19,auVar23);
    uVar6 = vcmpsd_avx512f(auVar23,ZEXT816(0) << 0x40,1);
    (pcVar5->parameters).init_mutation_variable_mean =
         (double)((ulong)!(bool)((byte)uVar6 & 1) * auVar27._0_8_);
  }
  if ((ulong)ABS(params->init_mutation_variable_stddev) < 0x7ff0000000000000) {
    auVar24._8_8_ = 0;
    auVar24._0_8_ = params->init_mutation_variable_stddev;
    auVar27 = vminsd_avx(auVar19,auVar24);
    uVar6 = vcmpsd_avx512f(auVar24,ZEXT816(0) << 0x40,1);
    (pcVar5->parameters).init_mutation_variable_stddev =
         (double)((ulong)!(bool)((byte)uVar6 & 1) * auVar27._0_8_);
  }
  if ((ulong)ABS(params->init_mutation_value_mean) < 0x7ff0000000000000) {
    auVar25._8_8_ = 0;
    auVar25._0_8_ = params->init_mutation_value_mean;
    auVar27 = vminsd_avx(auVar19,auVar25);
    uVar6 = vcmpsd_avx512f(auVar25,ZEXT816(0) << 0x40,1);
    (pcVar5->parameters).init_mutation_value_mean =
         (double)((ulong)!(bool)((byte)uVar6 & 1) * auVar27._0_8_);
  }
  if ((ulong)ABS(params->init_mutation_value_stddev) < 0x7ff0000000000000) {
    auVar26._8_8_ = 0;
    auVar26._0_8_ = params->init_mutation_value_stddev;
    auVar27 = vminsd_avx(auVar19,auVar26);
    uVar6 = vcmpsd_avx512f(auVar26,ZEXT816(0) << 0x40,1);
    (pcVar5->parameters).init_mutation_value_stddev =
         (double)((ulong)!(bool)((byte)uVar6 & 1) * auVar27._0_8_);
  }
  dVar2 = params->init_policy_random;
  dVar32 = 0.0;
  if ((0.0 <= dVar2) && (dVar2 <= 1.0)) {
    (pcVar5->parameters).init_policy_random = dVar2;
  }
  iVar8 = params->thread;
  (pcVar5->parameters).seed = params->seed;
  (pcVar5->parameters).thread = iVar8;
  lVar17 = 0x7fffffffffffffff;
  if (0 < params->limit) {
    lVar17 = params->limit;
  }
  (pcVar5->parameters).limit = lVar17;
  if (-1 < params->print_level) {
    (pcVar5->parameters).print_level = params->print_level;
  }
  dVar2 = params->w;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar2;
  if (0.0 <= dVar2) {
    if (params->limit < 1) {
      auVar27 = vroundsd_avx(auVar27,auVar27,9);
      dVar32 = auVar27._0_8_;
    }
    else {
      auVar33._0_8_ = (double)params->limit;
      auVar33._8_8_ = in_XMM5_Qb;
      if (1.0 <= dVar2) {
        auVar27 = vminsd_avx(auVar27,auVar33);
        dVar32 = auVar27._0_8_;
      }
      else {
        dVar32 = dVar2 * auVar33._0_8_;
      }
    }
  }
  (pcVar5->parameters).w = dVar32;
  uVar1 = params->pushes_limit;
  uVar4 = params->pushing_iteration_limit;
  auVar28._4_4_ = uVar4;
  auVar28._0_4_ = uVar1;
  auVar28._8_8_ = 0;
  auVar27 = vpmaxsd_avx(auVar28,ZEXT816(0) << 0x40);
  (pcVar5->parameters).pushes_limit = (int)auVar27._0_8_;
  (pcVar5->parameters).pushing_iteration_limit = (int)((ulong)auVar27._0_8_ >> 0x20);
  if (4 < params->init_population_size) {
    (pcVar5->parameters).init_population_size = params->init_population_size;
  }
  auVar29._8_8_ = 0;
  auVar29._0_8_ = params->init_kappa_improve_start;
  uVar6 = vcmpsd_avx512f(auVar29,ZEXT816(0) << 0x40,1);
  auVar27 = vminsd_avx(auVar19,auVar29);
  dVar2 = (double)((ulong)!(bool)((byte)uVar6 & 1) * auVar27._0_8_);
  auVar18._8_8_ = auVar27._8_8_;
  auVar18._0_8_ = dVar2;
  (pcVar5->parameters).init_kappa_improve_start = dVar2;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = params->init_kappa_improve_increase;
  uVar6 = vcmpsd_avx512f(auVar30,ZEXT816(0) << 0x40,1);
  auVar27 = vminsd_avx(auVar19,auVar30);
  (pcVar5->parameters).init_kappa_improve_increase =
       (double)((ulong)!(bool)((byte)uVar6 & 1) * auVar27._0_8_);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = params->init_kappa_improve_stop;
  uVar6 = vcmpsd_avx512f(auVar31,auVar18,1);
  bVar7 = (bool)((byte)uVar6 & 1);
  auVar19 = vminsd_avx(auVar19,auVar31);
  (pcVar5->parameters).init_kappa_improve_stop =
       (double)((ulong)bVar7 * (long)dVar2 + (ulong)!bVar7 * auVar19._0_8_);
  cVar9 = params->order;
  fVar10 = params->float_type;
  iVar11 = params->init_policy;
  cVar12 = params->cost_norm;
  mVar13 = params->mode;
  pVar14 = params->preprocessor;
  oVar15 = params->observer;
  (pcVar5->parameters).pre_order = params->pre_order;
  (pcVar5->parameters).order = cVar9;
  (pcVar5->parameters).float_type = fVar10;
  (pcVar5->parameters).init_policy = iVar11;
  (pcVar5->parameters).cost_norm = cVar12;
  (pcVar5->parameters).mode = mVar13;
  (pcVar5->parameters).preprocessor = pVar14;
  (pcVar5->parameters).observer = oVar15;
  sVar16 = params->solver;
  (pcVar5->parameters).storage = params->storage;
  (pcVar5->parameters).solver = sVar16;
  (pcVar5->parameters).debug = params->debug;
  return;
}

Assistant:

void
context_set_solver_parameters(const context_ptr& ctx,
                              const solver_parameters& params)
{
    ctx->parameters.time_limit = params.time_limit <= 0
                                   ? std::numeric_limits<double>::infinity()
                                   : params.time_limit;

    if (params.theta >= 0 && params.theta <= 1)
        ctx->parameters.theta = params.theta;

    if (params.delta == -1 || params.delta >= 0)
        ctx->parameters.delta = params.delta;

    if (params.kappa_min < params.kappa_max && params.kappa_min >= 0 &&
        params.kappa_min < 1 && params.kappa_max <= 1 &&
        params.kappa_step >= 0 && params.kappa_step < 1) {
        ctx->parameters.kappa_min = params.kappa_min;
        ctx->parameters.kappa_step = params.kappa_step;
        ctx->parameters.kappa_max = params.kappa_max;
    }

    if (params.alpha >= 0)
        ctx->parameters.alpha = params.alpha;

    if (std::isfinite(params.pushing_k_factor))
        ctx->parameters.pushing_k_factor = params.pushing_k_factor;

    if (std::isfinite(params.pushing_objective_amplifier))
        ctx->parameters.pushing_objective_amplifier =
          params.pushing_objective_amplifier;

    if (std::isfinite(params.init_crossover_bastert_insertion))
        ctx->parameters.init_crossover_bastert_insertion =
          std::clamp(params.init_crossover_bastert_insertion, 0.0, 1.0);

    if (std::isfinite(params.init_crossover_solution_selection_mean))
        ctx->parameters.init_crossover_solution_selection_mean =
          std::clamp(params.init_crossover_solution_selection_mean, 0.0, 1.0);

    if (std::isfinite(params.init_crossover_solution_selection_stddev))
        ctx->parameters.init_crossover_solution_selection_stddev = std::clamp(
          params.init_crossover_solution_selection_stddev, 0.0, 1.0);

    if (std::isfinite(params.init_mutation_variable_mean))
        ctx->parameters.init_mutation_variable_mean =
          std::clamp(params.init_mutation_variable_mean, 0.0, 1.0);

    if (std::isfinite(params.init_mutation_variable_stddev))
        ctx->parameters.init_mutation_variable_stddev =
          std::clamp(params.init_mutation_variable_stddev, 0.0, 1.0);

    if (std::isfinite(params.init_mutation_value_mean))
        ctx->parameters.init_mutation_value_mean =
          std::clamp(params.init_mutation_value_mean, 0.0, 1.0);

    if (std::isfinite(params.init_mutation_value_stddev))
        ctx->parameters.init_mutation_value_stddev =
          std::clamp(params.init_mutation_value_stddev, 0.0, 1.0);

    if (params.init_policy_random >= 0 && params.init_policy_random <= 1)
        ctx->parameters.init_policy_random = params.init_policy_random;

    ctx->parameters.seed = params.seed;
    ctx->parameters.thread = params.thread;

    ctx->parameters.limit = (params.limit <= 0)
                              ? std::numeric_limits<long int>::max()
                              : params.limit;

    if (params.print_level >= 0)
        ctx->parameters.print_level = params.print_level;

    // Convert the value [0..1] into a percentage of loop or use directly the
    // number if the value.

    if (params.w < 0) {
        ctx->parameters.w = 0;
    } else {
        if (params.limit > 0) {
            auto limit = static_cast<double>(params.limit);

            if (params.w < 1)
                ctx->parameters.w = limit * params.w;
            else
                ctx->parameters.w = std::min(limit, params.w);
        } else {
            ctx->parameters.w = std::floor(params.w);
        }
    }

    ctx->parameters.pushes_limit =
      params.pushes_limit <= 0 ? 0 : params.pushes_limit;

    ctx->parameters.pushing_iteration_limit =
      params.pushing_iteration_limit <= 0 ? 0 : params.pushing_iteration_limit;

    if (params.init_population_size >= 5)
        ctx->parameters.init_population_size = params.init_population_size;

    ctx->parameters.init_kappa_improve_start =
      std::clamp(params.init_kappa_improve_start, 0.0, 1.0);

    ctx->parameters.init_kappa_improve_increase =
      std::clamp(params.init_kappa_improve_increase, 0.0, 1.0);

    ctx->parameters.init_kappa_improve_stop =
      std::clamp(params.init_kappa_improve_stop,
                 ctx->parameters.init_kappa_improve_start,
                 1.0);

    ctx->parameters.pre_order = params.pre_order;
    ctx->parameters.order = params.order;
    ctx->parameters.float_type = params.float_type;
    ctx->parameters.init_policy = params.init_policy;
    ctx->parameters.cost_norm = params.cost_norm;
    ctx->parameters.mode = params.mode;
    ctx->parameters.preprocessor = params.preprocessor;
    ctx->parameters.observer = params.observer;
    ctx->parameters.storage = params.storage;
    ctx->parameters.solver = params.solver;
    ctx->parameters.debug = params.debug;
}